

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_buffered_write_char(sexp ctx,int c,sexp p)

{
  long lVar1;
  long in_RDX;
  undefined1 in_SIL;
  int res;
  sexp in_stack_00000020;
  sexp in_stack_00000028;
  int local_4;
  
  if ((*(long *)(in_RDX + 0x38) + 1U < *(ulong *)(in_RDX + 0x50)) ||
     (local_4 = sexp_buffered_flush(in_stack_00000028,in_stack_00000020,ctx._4_4_), local_4 == 0)) {
    lVar1 = *(long *)(in_RDX + 0x38);
    *(long *)(in_RDX + 0x38) = lVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDX + 0x28) + lVar1) = in_SIL;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sexp_buffered_write_char (sexp ctx, int c, sexp p) {
  int res;
  if (sexp_port_offset(p)+1 >= sexp_port_size(p))
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return res;
  sexp_port_buf(p)[sexp_port_offset(p)++] = c;
  return 0;
}